

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall Net::makeconnect(Net *this,string *ip)

{
  BIO *bp;
  long lVar1;
  
  std::__cxx11::string::append((char *)ip);
  bp = BIO_new_connect((ip->_M_dataplus)._M_p);
  this->sock = (BIO *)bp;
  if (bp == (BIO *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bio error",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
  }
  else {
    lVar1 = BIO_ctrl(bp,0x65,0,(void *)0x0);
    if (0 < lVar1) {
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bio error:",10);
    ERR_print_errors_fp(_stdout);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    this->closed = 1;
  }
  return -1;
}

Assistant:

int Net::makeconnect(std::string ip){
	ip+=":45451";
	sock=BIO_new_connect(ip.c_str());
	if(sock==NULL){
		std::cout<<"bio error"<<std::endl;
		return -1;
	}

	if(BIO_do_connect(sock)<=0){
		std::cout<<"bio error:";
		ERR_print_errors_fp(stdout);
		std::cout<<std::endl;
		closed=1;
		return -1;
	}
	return 0;
}